

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSpriteAmiga __thiscall
DataSourceAmiga::SpriteAmiga::merge_horizontaly(SpriteAmiga *this,PSpriteAmiga *right)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _func_int ***ppp_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _func_int *p_Var6;
  size_t y;
  element_type *peVar7;
  size_t x;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _func_int *p_Var9;
  long lVar10;
  bool bVar11;
  PSpriteAmiga PVar12;
  _func_int *local_28;
  
  if ((element_type *)(in_RDX._M_pi)->_vptr__Sp_counted_base[6] ==
      right[3].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  {
    local_28 = (_func_int *)
               ((long)&(right[2].
                        super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_vptr__Sp_counted_base +
               (long)(in_RDX._M_pi)->_vptr__Sp_counted_base[5]);
    std::make_shared<DataSourceAmiga::SpriteAmiga,unsigned_long,unsigned_long&>
              ((unsigned_long *)this,(unsigned_long *)&local_28);
    p_Var5 = right[3].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    pp_Var1 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var1[7];
    p_Var6 = (this->super_SpriteBase).super_Sprite._vptr_Sprite[7];
    p_Var2 = right[2].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    peVar3 = right[3].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    for (peVar7 = (element_type *)0x0; peVar7 != peVar3;
        peVar7 = (element_type *)((long)&(peVar7->super_SpriteBase).super_Sprite._vptr_Sprite + 1))
    {
      lVar10 = 0;
      for (p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; p_Var2 != p_Var8;
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&p_Var8->_vptr__Sp_counted_base + 1)) {
        *(undefined4 *)(p_Var6 + (long)p_Var8 * 4) =
             *(undefined4 *)((long)&p_Var5->_vptr__Sp_counted_base + (long)p_Var8 * 4);
        lVar10 = lVar10 + -4;
      }
      p_Var9 = pp_Var1[5];
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)p_Var5 - lVar10);
      p_Var6 = p_Var6 + -lVar10;
      while (bVar11 = p_Var9 != (_func_int *)0x0, p_Var9 = p_Var9 + -1, bVar11) {
        ppp_Var4 = &(in_RDX._M_pi)->_vptr__Sp_counted_base;
        in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&(in_RDX._M_pi)->_vptr__Sp_counted_base + 4);
        *(undefined4 *)p_Var6 = *(undefined4 *)ppp_Var4;
        p_Var6 = p_Var6 + 4;
      }
    }
  }
  else {
    (this->super_SpriteBase).super_Sprite._vptr_Sprite = (_func_int **)0x0;
    (this->super_SpriteBase).super_Sprite.super_enable_shared_from_this<Data::Sprite>._M_weak_this.
    super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  PVar12.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  PVar12.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PSpriteAmiga)
         PVar12.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::SpriteAmiga::merge_horizontaly(PSpriteAmiga right) {
  if (right->height != height) {
    return nullptr;
  }

  PSpriteAmiga result = std::make_shared<SpriteAmiga>(width + right->width,
                                                      height);

  uint32_t *src_l = reinterpret_cast<uint32_t*>(data);
  uint32_t *src_r = reinterpret_cast<uint32_t*>(right->data);
  uint32_t *res = reinterpret_cast<uint32_t*>(result->data);
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      *res++ = *src_l++;
    }
    for (size_t x = 0; x < right->width; x++) {
      *res++ = *src_r++;
    }
  }

  return result;
}